

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O0

_Bool upb_EnumDef_CheckNumber(upb_EnumDef *e,int32_t num)

{
  _Bool _Var1;
  int32_t num_local;
  upb_EnumDef *e_local;
  
  _Var1 = upb_MiniTableEnum_CheckValue(e->layout,num);
  return _Var1;
}

Assistant:

bool upb_EnumDef_CheckNumber(const upb_EnumDef* e, int32_t num) {
  // We could use upb_EnumDef_FindValueByNumber(e, num) != NULL, but we expect
  // this to be faster (especially for small numbers).
  return upb_MiniTableEnum_CheckValue(e->layout, num);
}